

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O1

ChTriangleMeshConnected *
chrono::geometry::ChTriangleMeshConnected::Merge
          (ChTriangleMeshConnected *__return_storage_ptr__,
          vector<chrono::geometry::ChTriangleMeshConnected,_std::allocator<chrono::geometry::ChTriangleMeshConnected>_>
          *meshes)

{
  int *piVar1;
  long lVar2;
  ChTriangleMeshConnected *pCVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ChVector<int> v;
  vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> tmp;
  ChVector<int> local_c4;
  vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> local_b8;
  ChTriangleMeshConnected *local_a0;
  long local_98;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_90;
  vector<chrono::ChColor,std::allocator<chrono::ChColor>> *local_88;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_80;
  vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *local_78;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_70;
  vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *local_68;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_60;
  vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  (__return_storage_ptr__->super_ChTriangleMesh).super_ChGeometry._vptr_ChGeometry =
       (_func_int **)&PTR__ChTriangleMeshConnected_00b669b8;
  (__return_storage_ptr__->m_vertices).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_vertices).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_vertices).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_normals).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_normals).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_normals).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_UV).
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_UV).
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_UV).
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_colors).
  super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_colors).
  super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_colors).
  super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_face_v_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_face_v_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_face_v_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_face_n_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_face_n_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_face_n_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_face_uv_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_face_uv_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_face_uv_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_face_col_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_face_col_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_face_col_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_face_uv_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_face_uv_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_face_col_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_face_col_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_face_col_indices).
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_face_mat_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_filename).field_2;
  (__return_storage_ptr__->m_filename)._M_string_length = 0;
  (__return_storage_ptr__->m_filename).field_2._M_local_buf[0] = '\0';
  lVar6 = *(long *)meshes;
  local_50 = *(long *)(meshes + 8);
  if (lVar6 != local_50) {
    local_58 = (vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
               &__return_storage_ptr__->m_vertices;
    local_68 = (vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
               &__return_storage_ptr__->m_normals;
    local_78 = (vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)
               &__return_storage_ptr__->m_UV;
    local_88 = (vector<chrono::ChColor,std::allocator<chrono::ChColor>> *)
               &__return_storage_ptr__->m_colors;
    local_60 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
               &__return_storage_ptr__->m_face_v_indices;
    local_70 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
               &__return_storage_ptr__->m_face_n_indices;
    local_80 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
               &__return_storage_ptr__->m_face_uv_indices;
    local_90 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
               &__return_storage_ptr__->m_face_col_indices;
    iVar7 = 0;
    iVar9 = 0;
    iVar4 = 0;
    iVar8 = 0;
    local_a0 = __return_storage_ptr__;
    do {
      std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector<double>*,std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>>>
                (local_58,(__return_storage_ptr__->m_vertices).
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(lVar6 + 8),
                 *(undefined8 *)(lVar6 + 0x10));
      local_b8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::reserve
                (&local_b8,
                 (*(long *)(lVar6 + 0x70) - *(long *)(lVar6 + 0x68) >> 2) * -0x5555555555555555);
      piVar1 = *(int **)(lVar6 + 0x70);
      local_98 = lVar6;
      for (piVar5 = *(int **)(lVar6 + 0x68); pCVar3 = local_a0, piVar5 != piVar1;
          piVar5 = piVar5 + 3) {
        local_c4.m_data[1] = piVar5[1] + iVar7;
        local_c4.m_data[0] = *piVar5 + iVar7;
        local_c4.m_data[2] = piVar5[2] + iVar7;
        std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
        emplace_back<chrono::ChVector<int>>
                  ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)&local_b8,
                   &local_c4);
      }
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector<int>*,std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>>>
                (local_60,(local_a0->m_face_v_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                 local_b8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_b8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      lVar6 = local_98;
      local_38 = *(long *)(local_98 + 0x10) - *(long *)(local_98 + 8);
      if (local_b8.
          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector<double>*,std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>>>
                (local_68,(pCVar3->m_normals).
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(lVar6 + 0x20),
                 *(undefined8 *)(lVar6 + 0x28));
      local_b8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::reserve
                (&local_b8,
                 (*(long *)(lVar6 + 0x88) - *(long *)(lVar6 + 0x80) >> 2) * -0x5555555555555555);
      piVar1 = *(int **)(lVar6 + 0x88);
      for (piVar5 = *(int **)(lVar6 + 0x80); pCVar3 = local_a0, piVar5 != piVar1;
          piVar5 = piVar5 + 3) {
        local_c4.m_data[1] = piVar5[1] + iVar9;
        local_c4.m_data[0] = *piVar5 + iVar9;
        local_c4.m_data[2] = piVar5[2] + iVar9;
        std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
        emplace_back<chrono::ChVector<int>>
                  ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)&local_b8,
                   &local_c4);
      }
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector<int>*,std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>>>
                (local_70,(local_a0->m_face_n_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                 local_b8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_b8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      lVar6 = local_98;
      local_40 = *(long *)(local_98 + 0x28) - *(long *)(local_98 + 0x20);
      if (local_b8.
          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector2<double>*,std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>>>
                (local_78,(pCVar3->m_UV).
                          super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(lVar6 + 0x38),
                 *(undefined8 *)(lVar6 + 0x40));
      local_b8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::reserve
                (&local_b8,
                 (*(long *)(lVar6 + 0xa0) - *(long *)(lVar6 + 0x98) >> 2) * -0x5555555555555555);
      piVar1 = *(int **)(lVar6 + 0xa0);
      for (piVar5 = *(int **)(lVar6 + 0x98); pCVar3 = local_a0, piVar5 != piVar1;
          piVar5 = piVar5 + 3) {
        local_c4.m_data[1] = piVar5[1] + iVar4;
        local_c4.m_data[0] = *piVar5 + iVar4;
        local_c4.m_data[2] = piVar5[2] + iVar4;
        std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
        emplace_back<chrono::ChVector<int>>
                  ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)&local_b8,
                   &local_c4);
      }
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector<int>*,std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>>>
                (local_80,(local_a0->m_face_uv_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                 local_b8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_b8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      lVar6 = local_98;
      local_48 = *(long *)(local_98 + 0x40) - *(long *)(local_98 + 0x38);
      if (local_b8.
          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<chrono::ChColor,std::allocator<chrono::ChColor>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChColor*,std::vector<chrono::ChColor,std::allocator<chrono::ChColor>>>>
                (local_88,(pCVar3->m_colors).
                          super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
                          _M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(lVar6 + 0x50),
                 *(undefined8 *)(lVar6 + 0x58));
      local_b8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::reserve
                (&local_b8,
                 (*(long *)(lVar6 + 0xb8) - *(long *)(lVar6 + 0xb0) >> 2) * -0x5555555555555555);
      piVar1 = *(int **)(lVar6 + 0xb8);
      for (piVar5 = *(int **)(lVar6 + 0xb0); __return_storage_ptr__ = local_a0, piVar5 != piVar1;
          piVar5 = piVar5 + 3) {
        local_c4.m_data[1] = piVar5[1] + iVar8;
        local_c4.m_data[0] = *piVar5 + iVar8;
        local_c4.m_data[2] = piVar5[2] + iVar8;
        std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
        emplace_back<chrono::ChVector<int>>
                  ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)&local_b8,
                   &local_c4);
      }
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector<int>*,std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>>>
                (local_90,(local_a0->m_face_col_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                 local_b8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_b8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      lVar6 = *(long *)(local_98 + 0x58);
      lVar2 = *(long *)(local_98 + 0x50);
      if (local_b8.
          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar7 = iVar7 + (int)(local_38 >> 3) * -0x55555555;
      iVar9 = iVar9 + (int)(local_40 >> 3) * -0x55555555;
      iVar4 = iVar4 + (int)(local_48 >> 4);
      iVar8 = iVar8 + (int)((ulong)(lVar6 - lVar2) >> 2) * -0x55555555;
      lVar6 = local_98 + 0x100;
    } while (lVar6 != local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

ChTriangleMeshConnected ChTriangleMeshConnected::Merge(std::vector<ChTriangleMeshConnected>& meshes) {
    ChTriangleMeshConnected trimesh;
    auto& vertices = trimesh.m_vertices;
    auto& normals = trimesh.m_normals;
    auto& uvs = trimesh.m_UV;
    auto& colors = trimesh.m_colors;
    auto& idx_vertices = trimesh.m_face_v_indices;
    auto& idx_normals = trimesh.m_face_n_indices;
    auto& idx_uvs = trimesh.m_face_uv_indices;
    auto& idx_colors = trimesh.m_face_col_indices;

    int v_off = 0;
    int n_off = 0;
    int uv_off = 0;
    int c_off = 0;
    for (auto& m : meshes) {
        {
            vertices.insert(vertices.end(), m.m_vertices.begin(), m.m_vertices.end());
            std::vector<ChVector<int>> tmp;
            tmp.reserve(m.m_face_v_indices.size());
            std::transform(m.m_face_v_indices.begin(), m.m_face_v_indices.end(), std::back_inserter(tmp),
                           [&v_off](ChVector<int>& a) { return a + v_off; });
            idx_vertices.insert(idx_vertices.end(), tmp.begin(), tmp.end());
            v_off += static_cast<int>(m.m_vertices.size());
        }

        {
            normals.insert(normals.end(), m.m_normals.begin(), m.m_normals.end());
            std::vector<ChVector<int>> tmp;
            tmp.reserve(m.m_face_n_indices.size());
            std::transform(m.m_face_n_indices.begin(), m.m_face_n_indices.end(), std::back_inserter(tmp),
                           [&n_off](ChVector<int>& a) { return a + n_off; });
            idx_normals.insert(idx_normals.end(), tmp.begin(), tmp.end());
            n_off += static_cast<int>(m.m_normals.size());
        }

        {
            uvs.insert(uvs.end(), m.m_UV.begin(), m.m_UV.end());
            std::vector<ChVector<int>> tmp;
            tmp.reserve(m.m_face_uv_indices.size());
            std::transform(m.m_face_uv_indices.begin(), m.m_face_uv_indices.end(), std::back_inserter(tmp),
                           [&uv_off](ChVector<int>& a) { return a + uv_off; });
            idx_uvs.insert(idx_uvs.end(), tmp.begin(), tmp.end());
            uv_off += static_cast<int>(m.m_UV.size());
        }

        {
            colors.insert(colors.end(), m.m_colors.begin(), m.m_colors.end());
            std::vector<ChVector<int>> tmp;
            tmp.reserve(m.m_face_col_indices.size());
            std::transform(m.m_face_col_indices.begin(), m.m_face_col_indices.end(), std::back_inserter(tmp),
                           [&c_off](ChVector<int>& a) { return a + c_off; });
            idx_colors.insert(idx_colors.end(), tmp.begin(), tmp.end());
            c_off += static_cast<int>(m.m_colors.size());
        }
    }

    return trimesh;
}